

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O2

wchar_t borg_panel_wid(void)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = Term->wid;
  if (Term == angband_term[0]) {
    iVar1 = iVar1 + ~col_map[Term->sidebar_mode];
  }
  wVar2 = iVar1 / (int)(uint)tile_width;
  if (wVar2 < L'\x02') {
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

int borg_panel_wid(void)
{
    int panel_wid;

    /* Use dimensions that match those in ui-output.c. */
    if (Term == term_screen) {
        panel_wid = SCREEN_WID;
    } else {
        panel_wid = Term->wid / tile_width;
    }
    /* Bound below to avoid division by zero. */
    return MAX(panel_wid, 1);
}